

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_1,_0>::rescalePartials
          (BeagleCPU4StateImpl<double,_1,_0> *this,double *destP,double *scaleFactors,
          double *cumulativeScaleFactors,int fillWithOnes)

{
  double *pdVar1;
  long lVar2;
  undefined8 uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int k;
  long lVar7;
  int iVar8;
  int iVar9;
  bool bVar10;
  double dVar11;
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  lVar2 = (this->super_BeagleCPUImpl<double,_1,_0>).kFlags;
  lVar7 = 0;
  iVar9 = 0;
  do {
    if ((this->super_BeagleCPUImpl<double,_1,_0>).kPatternCount <= lVar7) {
      return;
    }
    uVar5 = (this->super_BeagleCPUImpl<double,_1,_0>).kCategoryCount;
    auVar12 = ZEXT816(0) << 0x40;
    iVar4 = (this->super_BeagleCPUImpl<double,_1,_0>).kPaddedPatternCount * 4;
    uVar5 = ~((int)uVar5 >> 0x1f) & uVar5;
    iVar8 = iVar9;
    uVar6 = uVar5;
    while (bVar10 = uVar6 != 0, uVar6 = uVar6 - 1, bVar10) {
      auVar17._8_8_ = 0;
      auVar17._0_8_ = destP[iVar8];
      auVar18._8_8_ = 0;
      auVar18._0_8_ = destP[(long)iVar8 + 1];
      auVar15._8_8_ = 0;
      auVar15._0_8_ = destP[(long)iVar8 + 2];
      auVar14._8_8_ = 0;
      auVar14._0_8_ = destP[(long)iVar8 + 3];
      iVar8 = iVar8 + iVar4;
      auVar12 = vmaxsd_avx(auVar17,auVar12);
      auVar12 = vmaxsd_avx(auVar18,auVar12);
      auVar12 = vmaxsd_avx(auVar15,auVar12);
      auVar12 = vmaxsd_avx(auVar14,auVar12);
    }
    uVar3 = vcmpsd_avx512f(auVar12,ZEXT816(0),0);
    bVar10 = (bool)((byte)uVar3 & 1);
    dVar11 = (double)((ulong)bVar10 * 0x3ff0000000000000 + (ulong)!bVar10 * auVar12._0_8_);
    dVar13 = 1.0 / dVar11;
    iVar8 = iVar9;
    while (bVar10 = uVar5 != 0, uVar5 = uVar5 - 1, bVar10) {
      pdVar1 = destP + iVar8;
      auVar16._0_8_ = dVar13 * *pdVar1;
      auVar16._8_8_ = dVar13 * pdVar1[1];
      auVar16._16_8_ = dVar13 * pdVar1[2];
      auVar16._24_8_ = dVar13 * pdVar1[3];
      *(undefined1 (*) [32])(destP + iVar8) = auVar16;
      iVar8 = iVar8 + iVar4;
    }
    if (((uint)lVar2 >> 10 & 1) == 0) {
      scaleFactors[lVar7] = dVar11;
      if (cumulativeScaleFactors != (double *)0x0) {
        dVar11 = log(dVar11);
LAB_001336fa:
        cumulativeScaleFactors[lVar7] = dVar11 + cumulativeScaleFactors[lVar7];
      }
    }
    else {
      dVar11 = log(dVar11);
      scaleFactors[lVar7] = dVar11;
      if (cumulativeScaleFactors != (double *)0x0) goto LAB_001336fa;
    }
    lVar7 = lVar7 + 1;
    iVar9 = iVar9 + 4;
  } while( true );
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::rescalePartials(REALTYPE* destP,
		REALTYPE* scaleFactors,
		REALTYPE* cumulativeScaleFactors,
        const int  fillWithOnes) {

	bool useLogScalars = kFlags & BEAGLE_FLAG_SCALERS_LOG;

    for (int k = 0; k < kPatternCount; k++) {
    	REALTYPE max = 0;
        const int patternOffset = k * 4;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * 4 + patternOffset;

#ifdef BEAGLE_TEST_OPTIMIZATION
            REALTYPE max01 = FAST_MAX(destP[offset + 0], destP[offset + 1]);
            REALTYPE max23 = FAST_MAX(destP[offset + 2], destP[offset + 3]);
            max = FAST_MAX(max, max01);
            max = FAST_MAX(max, max23);
#else
			#pragma unroll
            for (int i = 0; i < 4; i++) {
                if(destP[offset] > max)
                    max = destP[offset];
                offset++;
            }
#endif
        }

        if (max == 0)
            max = REALTYPE(1.0);

        REALTYPE oneOverMax = REALTYPE(1.0) / max;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * 4 + patternOffset;
			#pragma unroll
            for (int i = 0; i < 4; i++)
                destP[offset++] *= oneOverMax;
        }

        if (useLogScalars) {
            REALTYPE logMax = log(max);
            scaleFactors[k] = logMax;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += logMax;
        } else {
            scaleFactors[k] = max;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += log(max);
        }
    }
}